

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

optional<std::array<tinyusdz::value::half,_3UL>_> * __thiscall
tinyusdz::Attribute::get_value<std::array<tinyusdz::value::half,3ul>>
          (optional<std::array<tinyusdz::value::half,_3UL>_> *__return_storage_ptr__,Attribute *this
          )

{
  optional<std::array<tinyusdz::value::half,_3UL>_> local_20;
  Attribute *local_18;
  Attribute *this_local;
  
  local_18 = this;
  this_local = (Attribute *)__return_storage_ptr__;
  primvar::PrimVar::get_value<std::array<tinyusdz::value::half,3ul>>(&local_20,&this->_var);
  nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::
  optional<std::array<tinyusdz::value::half,_3UL>,_0>(__return_storage_ptr__,&local_20);
  nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::~optional(&local_20);
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {
    return _var.get_value<T>();
  }